

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O0

void __thiscall
wasm::PassRunner::add
          (PassRunner *this,unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass)

{
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> local_20;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *local_18;
  unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *pass_local;
  PassRunner *this_local;
  
  local_18 = pass;
  pass_local = (unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> *)this;
  std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::unique_ptr(&local_20,pass);
  (**(code **)(*(long *)this + 0x10))(this,&local_20);
  std::unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_>::~unique_ptr(&local_20);
  return;
}

Assistant:

void add(std::unique_ptr<Pass> pass) { doAdd(std::move(pass)); }